

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O3

void Abc_NtkWriteAig(Abc_Ntk_t *pNtk,char *pFileName)

{
  void **ppvVar1;
  void *pvVar2;
  undefined8 *puVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  FILE *__s;
  uint *__ptr;
  void *pvVar8;
  Abc_Obj_t *pAVar9;
  char *pcVar10;
  Vec_Ptr_t *pVVar11;
  size_t __size;
  long lVar12;
  int iVar13;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                  ,0x2d3,"void Abc_NtkWriteAig(Abc_Ntk_t *, char *)");
  }
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                  ,0x2d4,"void Abc_NtkWriteAig(Abc_Ntk_t *, char *)");
  }
  __s = _stdout;
  if (pFileName != (char *)0x0) {
    __s = fopen(pFileName,"w");
  }
  if (__s == (FILE *)0x0) {
    puts("Cannot open output file.");
    return;
  }
  iVar6 = pNtk->vObjs->nSize;
  uVar5 = (long)iVar6 * 2;
  __ptr = (uint *)malloc(0x10);
  uVar4 = (uint)uVar5;
  uVar7 = 0x10;
  if (0xe < uVar4 - 1) {
    uVar7 = uVar4;
  }
  *__ptr = uVar7;
  if (uVar7 == 0) {
    __ptr[2] = 0;
    __ptr[3] = 0;
    if (iVar6 < 1) goto LAB_003163b3;
    __size = (uVar5 & 0xffffffff) << 2;
LAB_00316381:
    pvVar8 = malloc(__size);
LAB_00316389:
    *(void **)(__ptr + 2) = pvVar8;
    if (pvVar8 == (void *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    *__ptr = uVar4;
  }
  else {
    pvVar8 = malloc((long)(int)uVar7 << 2);
    *(void **)(__ptr + 2) = pvVar8;
    if ((int)uVar7 < (int)uVar4) {
      __size = (long)iVar6 << 3;
      if (pvVar8 == (void *)0x0) goto LAB_00316381;
      pvVar8 = realloc(pvVar8,__size);
      goto LAB_00316389;
    }
  }
  if (0 < iVar6) {
    memset(pvVar8,0xff,(uVar5 & 0xffffffff) << 2);
  }
LAB_003163b3:
  __ptr[1] = uVar4;
  pAVar9 = Abc_AigConst1(pNtk);
  if ((-1 < pAVar9->Id * 2) && (uVar7 = pAVar9->Id * 2 + 1, (int)uVar7 < (int)uVar4)) {
    pvVar8 = *(void **)(__ptr + 2);
    *(undefined4 *)((long)pvVar8 + (ulong)uVar7 * 4) = 0;
    pAVar9 = Abc_AigConst1(pNtk);
    uVar7 = pAVar9->Id * 2;
    if ((-1 < (int)uVar7) && (uVar7 < uVar4)) {
      *(undefined4 *)((long)pvVar8 + (ulong)uVar7 * 4) = 1;
      pVVar11 = pNtk->vPis;
      if (pVVar11->nSize < 1) {
        iVar6 = 2;
      }
      else {
        ppvVar1 = pVVar11->pArray;
        lVar12 = 0;
        iVar13 = 2;
        do {
          pvVar2 = ppvVar1[lVar12];
          uVar7 = *(int *)((long)pvVar2 + 0x10) * 2;
          if (((int)uVar7 < 0) || (uVar4 <= uVar7)) goto LAB_003168a8;
          *(int *)((long)pvVar8 + (ulong)uVar7 * 4) = iVar13;
          iVar6 = *(int *)((long)pvVar2 + 0x10);
          if ((iVar6 * 2 < 0) || (uVar7 = iVar6 * 2 + 1, uVar4 <= uVar7)) goto LAB_003168a8;
          iVar6 = iVar13 + 2;
          *(int *)((long)pvVar8 + (ulong)uVar7 * 4) = iVar13 + 1;
          lVar12 = lVar12 + 1;
          iVar13 = iVar6;
        } while (lVar12 < pVVar11->nSize);
      }
      pVVar11 = pNtk->vObjs;
      iVar13 = pVVar11->nSize;
      if (0 < iVar13) {
        ppvVar1 = pVVar11->pArray;
        lVar12 = 0;
        do {
          puVar3 = (undefined8 *)ppvVar1[lVar12];
          if (puVar3 != (undefined8 *)0x0) {
            if (((ulong)puVar3 & 1) != 0) goto LAB_003168d0;
            if (*(int *)*puVar3 != 3) goto LAB_003168c7;
            if (*(int *)((long)puVar3 + 0x1c) == 2) {
              uVar7 = *(int *)(puVar3 + 2) * 2;
              if (((int)uVar7 < 0) || ((int)uVar4 <= (int)uVar7)) goto LAB_003168a8;
              *(int *)((long)pvVar8 + (ulong)uVar7 * 4) = iVar6;
              if ((*(int *)(puVar3 + 2) * 2 < 0) ||
                 (uVar7 = *(int *)(puVar3 + 2) * 2 + 1, uVar4 <= uVar7)) goto LAB_003168a8;
              iVar13 = iVar6 + 1;
              iVar6 = iVar6 + 2;
              *(int *)((long)pvVar8 + (ulong)uVar7 * 4) = iVar13;
              iVar13 = pVVar11->nSize;
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < iVar13);
      }
      fwrite("{\n",2,1,__s);
      fprintf(__s,"    \"%s\", ",pNtk->pName);
      fprintf(__s,"//  pi=%d  po=%d  and=%d",(ulong)(uint)pNtk->vPis->nSize,
              (ulong)(uint)pNtk->vPos->nSize,(ulong)(uint)pNtk->nObjCounts[7]);
      fputc(10,__s);
      fwrite("    { ",6,1,__s);
      pVVar11 = pNtk->vPis;
      if (0 < pVVar11->nSize) {
        lVar12 = 0;
        do {
          pcVar10 = Abc_ObjName((Abc_Obj_t *)pVVar11->pArray[lVar12]);
          fprintf(__s,"\"%s\",",pcVar10);
          lVar12 = lVar12 + 1;
          pVVar11 = pNtk->vPis;
        } while (lVar12 < pVVar11->nSize);
      }
      fwrite("NULL },\n",8,1,__s);
      fwrite("    { ",6,1,__s);
      pVVar11 = pNtk->vPos;
      if (0 < pVVar11->nSize) {
        lVar12 = 0;
        do {
          pcVar10 = Abc_ObjName((Abc_Obj_t *)pVVar11->pArray[lVar12]);
          fprintf(__s,"\"%s\",",pcVar10);
          lVar12 = lVar12 + 1;
          pVVar11 = pNtk->vPos;
        } while (lVar12 < pVVar11->nSize);
      }
      fwrite("NULL },\n",8,1,__s);
      fwrite("    { ",6,1,__s);
      pVVar11 = pNtk->vObjs;
      if (0 < pVVar11->nSize) {
        lVar12 = 0;
        do {
          puVar3 = (undefined8 *)pVVar11->pArray[lVar12];
          if (puVar3 != (undefined8 *)0x0) {
            if (((ulong)puVar3 & 1) != 0) goto LAB_003168d0;
            if (*(int *)*puVar3 != 3) goto LAB_003168c7;
            if (*(int *)((long)puVar3 + 0x1c) == 2) {
              if ((*(int *)puVar3[4] < 0) ||
                 (uVar7 = (*(uint *)((long)puVar3 + 0x14) >> 10 & 1) + *(int *)puVar3[4] * 2,
                 (int)uVar4 <= (int)uVar7)) goto LAB_003168ef;
              fprintf(__s,"%d,",(ulong)*(uint *)((long)pvVar8 + (ulong)uVar7 * 4));
              pVVar11 = pNtk->vObjs;
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < pVVar11->nSize);
      }
      fwrite("0 },\n",5,1,__s);
      fwrite("    { ",6,1,__s);
      pVVar11 = pNtk->vObjs;
      if (0 < pVVar11->nSize) {
        lVar12 = 0;
        do {
          puVar3 = (undefined8 *)pVVar11->pArray[lVar12];
          if (puVar3 != (undefined8 *)0x0) {
            if (((ulong)puVar3 & 1) != 0) goto LAB_003168d0;
            if (*(int *)*puVar3 != 3) goto LAB_003168c7;
            if (*(int *)((long)puVar3 + 0x1c) == 2) {
              if ((*(int *)(puVar3[4] + 4) < 0) ||
                 (uVar7 = (*(uint *)((long)puVar3 + 0x14) >> 0xb & 1) + *(int *)(puVar3[4] + 4) * 2,
                 (int)uVar4 <= (int)uVar7)) goto LAB_003168ef;
              fprintf(__s,"%d,",(ulong)*(uint *)((long)pvVar8 + (ulong)uVar7 * 4));
              pVVar11 = pNtk->vObjs;
            }
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < pVVar11->nSize);
      }
      fwrite("0 },\n",5,1,__s);
      fwrite("    { ",6,1,__s);
      pVVar11 = pNtk->vPos;
      if (0 < pVVar11->nSize) {
        lVar12 = 0;
        do {
          iVar6 = **(int **)((long)pVVar11->pArray[lVar12] + 0x20);
          if ((iVar6 < 0) ||
             (uVar7 = (*(uint *)((long)pVVar11->pArray[lVar12] + 0x14) >> 10 & 1) + iVar6 * 2,
             (int)uVar4 <= (int)uVar7)) {
LAB_003168ef:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          fprintf(__s,"%d,",(ulong)*(uint *)((long)pvVar8 + (ulong)uVar7 * 4));
          lVar12 = lVar12 + 1;
          pVVar11 = pNtk->vPos;
        } while (lVar12 < pVVar11->nSize);
      }
      fwrite("0 },\n",5,1,__s);
      fwrite("},\n",3,1,__s);
      if (__s != _stdout) {
        fclose(__s);
      }
      if (pvVar8 != (void *)0x0) {
        free(pvVar8);
      }
      free(__ptr);
      return;
    }
  }
LAB_003168a8:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
LAB_003168d0:
  pcVar10 = "!Abc_ObjIsComplement(pNode)";
  goto LAB_003168d7;
LAB_003168c7:
  pcVar10 = "Abc_NtkIsStrash(pNode->pNtk)";
LAB_003168d7:
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
}

Assistant:

void Abc_NtkWriteAig( Abc_Ntk_t * pNtk, char * pFileName )
{
    FILE * pFile;
    Vec_Int_t * vId2Num;
    Abc_Obj_t * pObj;
    int i, iLit;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) == 0 );
    if ( pFileName == NULL )
        pFile = stdout;
    else
        pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file.\n" );
        return;
    }
    vId2Num = Vec_IntAlloc( 2*Abc_NtkObjNumMax(pNtk) );
    Vec_IntFill( vId2Num, 2*Abc_NtkObjNumMax(pNtk), -1 );

    iLit = 0;
    Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(Abc_AigConst1(pNtk))+1, iLit++ );
    Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(Abc_AigConst1(pNtk))+0, iLit++ );
    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(pObj)+0, iLit++ );
        Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(pObj)+1, iLit++ );
    }
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(pObj)+0, iLit++ );
        Vec_IntWriteEntry( vId2Num, 2*Abc_ObjId(pObj)+1, iLit++ );
    }
    fprintf( pFile, "{\n" );
    fprintf( pFile, "    \"%s\", ", Abc_NtkName(pNtk) );
    fprintf( pFile, "//  pi=%d  po=%d  and=%d", Abc_NtkPiNum(pNtk), Abc_NtkPoNum(pNtk), Abc_NtkNodeNum(pNtk) );
    fprintf( pFile, "\n" );
    fprintf( pFile, "    { " );
    Abc_NtkForEachPi( pNtk, pObj, i )
        fprintf( pFile, "\"%s\",", Abc_ObjName(pObj) );
    fprintf( pFile, "NULL },\n" );
    fprintf( pFile, "    { " );
    Abc_NtkForEachPo( pNtk, pObj, i )
        fprintf( pFile, "\"%s\",", Abc_ObjName(pObj) );
    fprintf( pFile, "NULL },\n" );
    fprintf( pFile, "    { " );
    Abc_AigForEachAnd( pNtk, pObj, i )
        fprintf( pFile, "%d,", Vec_IntEntry(vId2Num, 2*Abc_ObjFaninId0(pObj) + Abc_ObjFaninC0(pObj)) );
    fprintf( pFile, "0 },\n" );
    fprintf( pFile, "    { " );
    Abc_AigForEachAnd( pNtk, pObj, i )
        fprintf( pFile, "%d,", Vec_IntEntry(vId2Num, 2*Abc_ObjFaninId1(pObj) + Abc_ObjFaninC1(pObj)) );
    fprintf( pFile, "0 },\n" );
    fprintf( pFile, "    { " );
    Abc_NtkForEachPo( pNtk, pObj, i )
        fprintf( pFile, "%d,", Vec_IntEntry(vId2Num, 2*Abc_ObjFaninId0(pObj) + Abc_ObjFaninC0(pObj)) );
    fprintf( pFile, "0 },\n" );
    fprintf( pFile, "},\n" );
    if ( pFile != stdout )
        fclose( pFile );
    Vec_IntFree( vId2Num );
}